

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_f16c.cpp
# Opt level: O1

void ncnn::innerproduct_transform_kernel_fp16s_sse_f16c
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  void *pvVar6;
  unsigned_short uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  char cVar13;
  int iVar14;
  long lVar15;
  undefined1 (*pauVar16) [16];
  undefined1 (*pauVar17) [16];
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  unsigned_short *puVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint local_d8;
  Mat local_c8;
  long local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_70 = (ulong)(uint)num_output;
  cVar13 = '\x01';
  if (opt->use_packing_layout == true) {
    cVar13 = '\b';
    if ((num_output & 7U) != 0) {
      cVar13 = ((num_output & 3U) == 0) * '\x03' + '\x01';
    }
  }
  if (cVar13 == '\x01') {
    Mat::reshape(&local_c8,weight_data,num_input,num_output,(Allocator *)0x0);
    cast_float32_to_float16(&local_c8,weight_data_tm,opt);
    if (local_c8.refcount != (int *)0x0) {
      LOCK();
      *local_c8.refcount = *local_c8.refcount + -1;
      UNLOCK();
      if (*local_c8.refcount == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else if (cVar13 == '\x04') {
    Mat::reshape(&local_c8,weight_data,num_input,num_output,(Allocator *)0x0);
    iVar14 = num_output + 3;
    if (-1 < num_output) {
      iVar14 = num_output;
    }
    Mat::create(weight_data_tm,num_input,iVar14 >> 2,8,4,(Allocator *)0x0);
    if (3 < num_output) {
      local_d8 = num_input & 0xfffffffc;
      lVar20 = 3;
      lVar22 = 2;
      lVar24 = 1;
      lVar15 = 0;
      uVar31 = 0;
      do {
        pvVar6 = local_c8.data;
        iVar14 = weight_data_tm->w;
        pvVar1 = weight_data_tm->data;
        sVar2 = weight_data_tm->elemsize;
        pauVar16 = (undefined1 (*) [16])((uVar31 >> 2) * (long)iVar14 * sVar2 + (long)pvVar1);
        lVar26 = (long)local_c8.w;
        if (num_input < 4) {
          lVar26 = local_c8.elemsize * lVar26;
          lVar11 = lVar26 * uVar31;
          lVar9 = (uVar31 | 1) * lVar26;
          lVar30 = (uVar31 | 2) * lVar26;
          lVar28 = lVar26 * (uVar31 | 3);
          uVar8 = 0;
        }
        else {
          lVar28 = local_c8.elemsize * lVar20 * lVar26;
          lVar30 = local_c8.elemsize * lVar22 * lVar26;
          lVar9 = local_c8.elemsize * lVar24 * lVar26;
          lVar26 = local_c8.elemsize * uVar31 * lVar26;
          iVar12 = 3;
          lVar11 = 0;
          do {
            pauVar17 = pauVar16;
            auVar33 = *(undefined1 (*) [16])((long)local_c8.data + lVar11 + lVar26);
            auVar35 = *(undefined1 (*) [16])((long)local_c8.data + lVar11 + lVar9);
            auVar37 = *(undefined1 (*) [16])((long)local_c8.data + lVar11 + lVar30);
            auVar38 = *(undefined1 (*) [16])((long)local_c8.data + lVar11 + lVar28);
            auVar3 = vpunpckldq_avx(auVar33,auVar35);
            auVar4 = vpunpckldq_avx(auVar37,auVar38);
            auVar33 = vpunpckhdq_avx(auVar33,auVar35);
            auVar35 = vpunpckhdq_avx(auVar37,auVar38);
            auVar38 = vpunpcklqdq_avx(auVar3,auVar4);
            auVar37 = vpunpckhqdq_avx(auVar3,auVar4);
            auVar3 = vpunpcklqdq_avx(auVar33,auVar35);
            auVar33 = vpunpckhqdq_avx(auVar33,auVar35);
            auVar36._16_16_ = auVar37;
            auVar36._0_16_ = auVar38;
            auVar34._16_16_ = auVar33;
            auVar34._0_16_ = auVar3;
            pauVar16 = (undefined1 (*) [16])
                       ((long)pvVar1 + lVar11 * 2 + sVar2 * lVar15 * (long)iVar14);
            auVar33 = vcvtps2ph_f16c(auVar36,3);
            *pauVar16 = auVar33;
            auVar33 = vcvtps2ph_f16c(auVar34,3);
            pauVar16[1] = auVar33;
            iVar12 = iVar12 + 4;
            lVar11 = lVar11 + 0x10;
            pauVar16 = pauVar16 + 2;
          } while (iVar12 < num_input);
          pauVar16 = pauVar17 + 2;
          lVar28 = lVar28 + lVar11;
          lVar30 = lVar30 + lVar11;
          lVar9 = lVar9 + lVar11;
          lVar11 = lVar26 + lVar11;
          uVar8 = local_d8;
        }
        if ((int)uVar8 < num_input) {
          lVar26 = 0;
          do {
            uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar26 * 4 + lVar11));
            *(unsigned_short *)(*pauVar16 + lVar26 * 8) = uVar7;
            uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar26 * 4 + lVar9));
            *(unsigned_short *)(*pauVar16 + lVar26 * 8 + 2) = uVar7;
            uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar26 * 4 + lVar30));
            *(unsigned_short *)(*pauVar16 + lVar26 * 8 + 4) = uVar7;
            uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar26 * 4 + lVar28));
            *(unsigned_short *)(*pauVar16 + lVar26 * 8 + 6) = uVar7;
            lVar26 = lVar26 + 1;
          } while (num_input - uVar8 != (int)lVar26);
        }
        uVar31 = uVar31 + 4;
        lVar20 = lVar20 + 4;
        lVar22 = lVar22 + 4;
        lVar24 = lVar24 + 4;
        lVar15 = lVar15 + 1;
      } while ((int)((uint)uVar31 | 3) < (int)local_70);
    }
    if (local_c8.refcount != (int *)0x0) {
      LOCK();
      *local_c8.refcount = *local_c8.refcount + -1;
      UNLOCK();
      if (*local_c8.refcount == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else if (cVar13 == '\b') {
    Mat::reshape(&local_c8,weight_data,num_input,num_output,(Allocator *)0x0);
    iVar14 = num_output + 7;
    if (-1 < num_output) {
      iVar14 = num_output;
    }
    Mat::create(weight_data_tm,num_input,iVar14 >> 3,0x10,8,(Allocator *)0x0);
    if (7 < num_output) {
      lVar20 = 1;
      lVar22 = 2;
      lVar24 = 3;
      lVar26 = 4;
      lVar28 = 5;
      lVar15 = 6;
      local_78 = 7;
      lVar30 = 0;
      uVar31 = 0;
      do {
        pvVar6 = local_c8.data;
        pvVar1 = weight_data_tm->data;
        puVar32 = (unsigned_short *)
                  ((uVar31 >> 3) * (long)weight_data_tm->w * weight_data_tm->elemsize + (long)pvVar1
                  );
        lVar9 = (long)local_c8.w;
        if (num_input < 8) {
          lVar9 = local_c8.elemsize * lVar9;
          lVar11 = lVar9 * uVar31;
          lVar19 = (uVar31 | 1) * lVar9;
          lVar21 = (uVar31 | 2) * lVar9;
          lVar23 = (uVar31 | 3) * lVar9;
          lVar25 = (uVar31 | 4) * lVar9;
          lVar27 = (uVar31 | 5) * lVar9;
          lVar29 = (uVar31 | 6) * lVar9;
          lVar9 = lVar9 * (uVar31 | 7);
          uVar8 = 0;
        }
        else {
          lVar18 = weight_data_tm->elemsize * lVar30 * (long)weight_data_tm->w;
          lVar11 = local_c8.elemsize * uVar31 * lVar9;
          lVar19 = local_c8.elemsize * lVar20 * lVar9;
          lVar21 = local_c8.elemsize * lVar22 * lVar9;
          lVar23 = local_c8.elemsize * lVar24 * lVar9;
          lVar25 = local_c8.elemsize * lVar26 * lVar9;
          lVar27 = local_c8.elemsize * lVar28 * lVar9;
          lVar29 = local_c8.elemsize * lVar15 * lVar9;
          lVar9 = local_c8.elemsize * local_78 * lVar9;
          iVar14 = 7;
          lVar10 = 0;
          do {
            auVar33 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar10 + lVar11),3
                                    );
            auVar35 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar10 + lVar19),3
                                    );
            auVar37 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar10 + lVar21),3
                                    );
            auVar38 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar10 + lVar23),3
                                    );
            auVar39 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar10 + lVar25),3
                                    );
            auVar40 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar10 + lVar27),3
                                    );
            auVar41 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar10 + lVar29),3
                                    );
            auVar42 = vcvtps2ph_f16c(*(undefined1 (*) [32])((long)local_c8.data + lVar10 + lVar9),3)
            ;
            auVar3 = vpunpcklwd_avx(auVar33,auVar35);
            auVar33 = vpunpckhwd_avx(auVar33,auVar35);
            auVar4 = vpunpcklwd_avx(auVar37,auVar38);
            auVar35 = vpunpckhwd_avx(auVar37,auVar38);
            auVar5 = vpunpcklwd_avx(auVar39,auVar40);
            auVar37 = vpunpckhwd_avx(auVar39,auVar40);
            auVar39 = vpunpcklwd_avx(auVar41,auVar42);
            auVar38 = vpunpckhwd_avx(auVar41,auVar42);
            auVar40 = vpunpckldq_avx(auVar3,auVar4);
            auVar3 = vpunpckhdq_avx(auVar3,auVar4);
            auVar4 = vpunpckldq_avx(auVar33,auVar35);
            auVar33 = vpunpckhdq_avx(auVar33,auVar35);
            auVar41 = vpunpckldq_avx(auVar5,auVar39);
            auVar35 = vpunpckhdq_avx(auVar5,auVar39);
            auVar5 = vpunpckldq_avx(auVar37,auVar38);
            auVar37 = vpunpckhdq_avx(auVar37,auVar38);
            auVar39 = vpunpcklqdq_avx(auVar40,auVar41);
            auVar38 = vpunpckhqdq_avx(auVar40,auVar41);
            auVar40 = vpunpcklqdq_avx(auVar3,auVar35);
            auVar35 = vpunpckhqdq_avx(auVar3,auVar35);
            auVar41 = vpunpcklqdq_avx(auVar4,auVar5);
            auVar3 = vpunpckhqdq_avx(auVar4,auVar5);
            auVar4 = vpunpcklqdq_avx(auVar33,auVar37);
            auVar33 = vpunpckhqdq_avx(auVar33,auVar37);
            *(undefined1 (*) [16])((long)pvVar1 + lVar10 * 4 + lVar18) = auVar39;
            *(undefined1 (*) [16])((long)pvVar1 + lVar10 * 4 + lVar18 + 0x10) = auVar38;
            *(undefined1 (*) [16])((long)pvVar1 + lVar10 * 4 + lVar18 + 0x20) = auVar40;
            *(undefined1 (*) [16])((long)pvVar1 + lVar10 * 4 + lVar18 + 0x30) = auVar35;
            *(undefined1 (*) [16])((long)pvVar1 + lVar10 * 4 + lVar18 + 0x40) = auVar41;
            *(undefined1 (*) [16])((long)pvVar1 + lVar10 * 4 + lVar18 + 0x50) = auVar3;
            *(undefined1 (*) [16])((long)pvVar1 + lVar10 * 4 + lVar18 + 0x60) = auVar4;
            *(undefined1 (*) [16])((long)pvVar1 + lVar10 * 4 + lVar18 + 0x70) = auVar33;
            puVar32 = puVar32 + 0x40;
            lVar10 = lVar10 + 0x20;
            iVar14 = iVar14 + 8;
          } while (iVar14 < num_input);
          lVar11 = lVar11 + lVar10;
          lVar19 = lVar19 + lVar10;
          lVar21 = lVar21 + lVar10;
          lVar23 = lVar23 + lVar10;
          lVar25 = lVar25 + lVar10;
          lVar27 = lVar27 + lVar10;
          lVar29 = lVar29 + lVar10;
          lVar9 = lVar9 + lVar10;
          uVar8 = num_input & 0xfffffff8;
          local_68 = uVar31;
        }
        local_60 = lVar30;
        local_58 = lVar15;
        local_50 = lVar28;
        local_48 = lVar26;
        local_40 = lVar24;
        local_38 = lVar22;
        if ((int)uVar8 < num_input) {
          lVar15 = 0;
          do {
            uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar15 * 4 + lVar11));
            *puVar32 = uVar7;
            uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar15 * 4 + lVar19));
            puVar32[1] = uVar7;
            uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar15 * 4 + lVar21));
            puVar32[2] = uVar7;
            uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar15 * 4 + lVar23));
            puVar32[3] = uVar7;
            uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar15 * 4 + lVar25));
            puVar32[4] = uVar7;
            uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar15 * 4 + lVar27));
            puVar32[5] = uVar7;
            uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar15 * 4 + lVar29));
            puVar32[6] = uVar7;
            uVar7 = float32_to_float16(*(float *)((long)pvVar6 + lVar15 * 4 + lVar9));
            puVar32[7] = uVar7;
            puVar32 = puVar32 + 8;
            lVar15 = lVar15 + 1;
          } while (num_input - uVar8 != (int)lVar15);
        }
        uVar31 = uVar31 + 8;
        lVar30 = local_60 + 1;
        lVar20 = lVar20 + 8;
        lVar22 = local_38 + 8;
        lVar24 = local_40 + 8;
        lVar26 = local_48 + 8;
        lVar28 = local_50 + 8;
        lVar15 = local_58 + 8;
        local_78 = local_78 + 8;
      } while ((int)((uint)uVar31 | 7) < (int)local_70);
    }
    if (local_c8.refcount != (int *)0x0) {
      LOCK();
      *local_c8.refcount = *local_c8.refcount + -1;
      UNLOCK();
      if (*local_c8.refcount == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return;
}

Assistant:

void innerproduct_transform_kernel_fp16s_sse_f16c(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, const Option& opt)
{
    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);
}